

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

prsndef * prsfold(prscxdef *ctx,prsndef *node)

{
  undefined1 uVar1;
  dbgcxdef *pdVar2;
  bool bVar3;
  int iVar4;
  tokcxdef *ptVar5;
  prsndef *ppVar6;
  mcmcxdef **ppmVar7;
  undefined4 uVar8;
  prscxdef *in_RSI;
  int b;
  int a;
  emtledef *ele;
  prsndef *retval;
  emtlidef *lst;
  tokdef t;
  prsndef *ncur;
  long val2;
  long val1;
  int typ2;
  int typ1;
  tokdef *tok2;
  tokdef *tok1;
  int typ;
  int can_fold;
  prsndef **n;
  int i;
  undefined4 in_stack_fffffffffffffeb8;
  uint in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  int in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  prscxdef *in_stack_fffffffffffffee0;
  int local_114;
  int *local_e8;
  prscxdef *local_60;
  dbgcxdef *local_50;
  undefined4 local_44;
  int local_30;
  tokcxdef **local_28;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar9;
  
  bVar3 = true;
  if (*(int *)&in_RSI->prscxerr == 0x3b) {
    iVar9 = 0;
    for (local_60 = in_RSI; local_60 != (prscxdef *)0x0; local_60 = (prscxdef *)local_60->prscxstab)
    {
      ptVar5 = (tokcxdef *)prsfold(in_RSI,(prsndef *)CONCAT44(iVar9,in_stack_ffffffffffffffe0));
      local_60->prscxtok = ptVar5;
      local_30 = 0x39;
      if ((*(int *)((long)&local_60->prscxtok->tokcxerr + 4) != 0) ||
         ((((local_30 = *(int *)&local_60->prscxtok->tokcxmem, local_30 != 0x37 &&
            (local_30 != 0x36)) && (local_30 != 0x4c)) &&
          (((local_30 != 0x4d && (local_30 != 0x4e)) && ((local_30 != 0x55 && (local_30 != 0x38)))))
          ))) {
        bVar3 = false;
      }
      if ((local_30 == 0x38) &&
         ((*(char *)&local_60->prscxtok->tokcxsend == '\x04' ||
          (*(char *)&local_60->prscxtok->tokcxsend == '\x05')))) {
        bVar3 = false;
      }
      if ((*(int *)((long)&local_60->prscxtok->tokcxerr + 4) == 0) && (local_30 == 0x38)) {
        prsdef(in_stack_fffffffffffffee0,
               (tokdef *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               in_stack_fffffffffffffed4);
      }
      iVar9 = iVar9 + 1;
    }
    if (!bVar3) {
      return (prsndef *)in_RSI;
    }
    local_e8 = (int *)prsbalo((prscxdef *)
                              CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                              in_stack_fffffffffffffebc);
    ppVar6 = prsnew0((prscxdef *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     (tokdef *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    *local_e8 = iVar9;
    local_e8 = local_e8 + 2;
    for (; in_RSI != (prscxdef *)0x0; in_RSI = (prscxdef *)in_RSI->prscxstab) {
      ptVar5 = in_RSI->prscxtok;
      uVar1 = *(undefined1 *)&ptVar5->tokcxmem;
      *(undefined1 *)local_e8 = uVar1;
      switch(uVar1) {
      case 0x36:
      case 0x4c:
      case 0x55:
        *(ulong *)(local_e8 + 2) = (ulong)*(ushort *)&ptVar5->tokcxlin;
        break;
      default:
        *(dbgcxdef **)(local_e8 + 2) = ptVar5->tokcxdbg;
        break;
      case 0x38:
        switch(*(undefined1 *)&ptVar5->tokcxsend) {
        case 1:
        case 8:
          *(undefined1 *)local_e8 = 0x46;
          break;
        case 2:
        case 7:
          *(undefined1 *)local_e8 = 0x49;
          break;
        case 3:
          *(undefined1 *)local_e8 = 0x40;
          break;
        default:
          errsigf((errcxdef *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                  (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0);
        case 0xe:
          *(undefined1 *)local_e8 = 0x40;
        }
        *(ulong *)(local_e8 + 2) = (ulong)*(ushort *)((long)&ptVar5->tokcxsend + 2);
      }
      local_e8 = local_e8 + 4;
    }
    return ppVar6;
  }
  local_28 = &in_RSI->prscxtok;
  for (iVar9 = *(int *)((long)&in_RSI->prscxerr + 4); iVar9 != 0; iVar9 = iVar9 + -1) {
    ptVar5 = (tokcxdef *)prsfold(in_RSI,(prsndef *)CONCAT44(iVar9,in_stack_ffffffffffffffe0));
    *local_28 = ptVar5;
    if ((*(int *)((long)&(*local_28)->tokcxerr + 4) != 0) ||
       (((((iVar4 = *(int *)&(*local_28)->tokcxmem, iVar4 != 0x37 && (iVar4 != 0x36)) &&
          (iVar4 != 0x4c)) && ((iVar4 != 0x4d && (iVar4 != 0x4e)))) && (iVar4 != 0x55)))) {
      bVar3 = false;
    }
    local_28 = local_28 + 1;
  }
  if (*(int *)((long)&in_RSI->prscxerr + 4) == 0) {
    return (prsndef *)in_RSI;
  }
  if (!bVar3) {
    return (prsndef *)in_RSI;
  }
  iVar9 = *(int *)((long)&in_RSI->prscxerr + 4);
  if (iVar9 == 1) {
    ptVar5 = in_RSI->prscxtok;
    local_114 = *(int *)&ptVar5->tokcxmem;
    pdVar2 = ptVar5->tokcxdbg;
    switch(*(undefined4 *)&in_RSI->prscxerr) {
    case 2:
      break;
    case 3:
      if (local_114 != 0x37) {
        errsigf((errcxdef *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0);
      }
      ptVar5->tokcxdbg = (dbgcxdef *)-(long)pdVar2;
      break;
    default:
      return (prsndef *)in_RSI;
    case 6:
      if (((local_114 != 0x37) && (local_114 != 0x4d)) && (local_114 != 0x4e)) {
        errsigf((errcxdef *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0);
      }
      if ((local_114 == 0x37) && (local_114 = 0x4d, pdVar2 != (dbgcxdef *)0x0)) {
        local_114 = 0x4e;
      }
      uVar8 = 0x4d;
      if (local_114 == 0x4d) {
        uVar8 = 0x4e;
      }
      *(undefined4 *)&ptVar5->tokcxmem = uVar8;
      break;
    case 0x1e:
      if (local_114 != 0x37) {
        errsigf((errcxdef *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0);
      }
      ptVar5->tokcxdbg = (dbgcxdef *)((ulong)pdVar2 ^ 0xffffffffffffffff);
    }
    goto LAB_0012e5d3;
  }
  if (iVar9 != 2) {
    if (iVar9 != 3) {
      return (prsndef *)in_RSI;
    }
    ppmVar7 = &in_RSI->prscxtok->tokcxmem;
    if (((*(int *)ppmVar7 != 0x37) && (*(int *)ppmVar7 != 0x4d)) && (*(int *)ppmVar7 != 0x4e)) {
      errsigf((errcxdef *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
              (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0);
    }
    if (*(int *)ppmVar7 == 0x37) {
      iVar9 = 0x4d;
      if (in_RSI->prscxtok->tokcxdbg != (dbgcxdef *)0x0) {
        iVar9 = 0x4e;
      }
    }
    else {
      iVar9 = *(int *)ppmVar7;
    }
    if (iVar9 == 0x4e) {
      return (prsndef *)in_RSI->prscxstab;
    }
    return (prsndef *)in_RSI->prscxgtab;
  }
  ptVar5 = in_RSI->prscxtok;
  ppmVar7 = &ptVar5->tokcxmem;
  local_50 = ptVar5->tokcxdbg;
  pdVar2 = (dbgcxdef *)in_RSI->prscxstab->toktfset;
  iVar9 = *(int *)ppmVar7;
  iVar4 = *(int *)&in_RSI->prscxstab->toktfsea;
  switch(*(undefined4 *)&in_RSI->prscxerr) {
  case 2:
  case 3:
    if (iVar9 == 0x36) {
      return (prsndef *)in_RSI;
    }
    if (iVar9 == 0x4c) {
      return (prsndef *)in_RSI;
    }
    if (iVar4 == 0x4c) {
      return (prsndef *)in_RSI;
    }
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
    if (iVar9 != 0x37) {
      return (prsndef *)in_RSI;
    }
    if (iVar4 != 0x37) {
      return (prsndef *)in_RSI;
    }
switchD_0012df90_caseD_10:
    if (((iVar9 == 0x4e) || (iVar9 == 0x4d)) && ((iVar4 == 0x4e || (iVar4 == 0x4d)))) {
      uVar8 = 0x4d;
      if ((iVar9 == 0x4e) != (iVar4 == 0x4e)) {
        uVar8 = 0x4e;
      }
      *(undefined4 *)ppmVar7 = uVar8;
    }
    else {
switchD_0012df90_caseD_4:
      if ((iVar9 != 0x37) || (iVar4 != 0x37)) {
        errsigf((errcxdef *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0);
      }
      local_44 = 0x37;
      switch(*(undefined4 *)&in_RSI->prscxerr) {
      case 2:
        local_50 = (dbgcxdef *)
                   ((long)&local_50->dbgcxfrm[0].dbgfargc + (long)(pdVar2->dbgcxfrm + -4));
        break;
      case 3:
        local_50 = (dbgcxdef *)((long)local_50 - (long)pdVar2);
        break;
      case 4:
        if (pdVar2 == (dbgcxdef *)0x0) {
          errsigf((errcxdef *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                  (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0);
        }
        local_50 = (dbgcxdef *)((long)local_50 / (long)pdVar2);
        break;
      case 5:
        local_50 = (dbgcxdef *)((long)pdVar2 * (long)local_50);
        break;
      default:
        return (prsndef *)in_RSI;
      case 7:
        local_44 = 0x4d;
        if (local_50 == pdVar2) {
          local_44 = 0x4e;
        }
        break;
      case 8:
        local_44 = 0x4d;
        if (local_50 != pdVar2) {
          local_44 = 0x4e;
        }
        break;
      case 9:
        local_44 = 0x4d;
        if ((long)pdVar2 < (long)local_50) {
          local_44 = 0x4e;
        }
        break;
      case 10:
        local_44 = 0x4d;
        if ((long)pdVar2 <= (long)local_50) {
          local_44 = 0x4e;
        }
        break;
      case 0xb:
        local_44 = 0x4d;
        if ((long)local_50 < (long)pdVar2) {
          local_44 = 0x4e;
        }
        break;
      case 0xc:
        local_44 = 0x4d;
        if ((long)local_50 <= (long)pdVar2) {
          local_44 = 0x4e;
        }
        break;
      case 0xd:
        if (pdVar2 == (dbgcxdef *)0x0) {
          errsigf((errcxdef *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                  (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0);
        }
        local_50 = (dbgcxdef *)((long)local_50 % (long)pdVar2);
        break;
      case 0x10:
        local_50 = (dbgcxdef *)((ulong)pdVar2 ^ (ulong)local_50);
        break;
      case 0x11:
        local_50 = (dbgcxdef *)((long)local_50 << ((byte)pdVar2 & 0x3f));
        break;
      case 0x12:
        local_50 = (dbgcxdef *)((long)local_50 >> ((byte)pdVar2 & 0x3f));
      }
      *(undefined4 *)ppmVar7 = local_44;
      ptVar5->tokcxdbg = local_50;
    }
LAB_0012e5d3:
    return (prsndef *)in_RSI->prscxtok;
  case 4:
  case 5:
  case 0xd:
  case 0x11:
  case 0x12:
    goto switchD_0012df90_caseD_4;
  default:
    return (prsndef *)in_RSI;
  case 0x10:
    goto switchD_0012df90_caseD_10;
  case 0x41:
  case 0x42:
    if ((((iVar9 != 0x37) && (iVar9 != 0x4d)) && (iVar9 != 0x4e)) ||
       (((iVar4 != 0x37 && (iVar4 != 0x4d)) && (iVar4 != 0x4e)))) {
      errsigf((errcxdef *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
              (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0);
    }
    if ((iVar9 == 0x37) && (iVar9 = 0x4d, local_50 != (dbgcxdef *)0x0)) {
      iVar9 = 0x4e;
    }
    if ((iVar4 == 0x37) && (iVar4 = 0x4d, pdVar2 != (dbgcxdef *)0x0)) {
      iVar4 = 0x4e;
    }
    if (*(int *)&in_RSI->prscxerr == 0x42) {
      bVar3 = iVar9 == 0x4e && iVar4 == 0x4e;
    }
    else {
      bVar3 = iVar9 == 0x4e || iVar4 == 0x4e;
    }
    uVar8 = 0x4d;
    if (bVar3) {
      uVar8 = 0x4e;
    }
    *(undefined4 *)ppmVar7 = uVar8;
    goto LAB_0012e5d3;
  }
}

Assistant:

static prsndef *prsfold(prscxdef *ctx, prsndef *node)
{
    int       i;
    prsndef **n;
    int       can_fold;
    int       typ;
    tokdef   *tok1, *tok2;
    int       typ1, typ2;
    long      val1, val2;
    prsndef  *ncur;
    
    can_fold = TRUE;                       /* assume we can do some folding */

    /* if this is a list-construction node, special handling is needed */
    if (node->prsntyp == TOKTRBRACK)
    {
        for (i=0, ncur = node ; ncur ; ++i, ncur = ncur->prsnv.prsnvn[1])
        {
            ncur->prsnv.prsnvn[0] = prsfold(ctx, ncur->prsnv.prsnvn[0]);
            typ = TOKTINVALID;
            if (ncur->prsnv.prsnvn[0]->prsnnlf != 0 ||
                ((typ = ncur->prsnv.prsnvn[0]->prsnv.prsnvt.toktyp)
                 != TOKTNUMBER && typ != TOKTSSTRING && typ != TOKTLIST
                 && typ != TOKTNIL && typ != TOKTTRUE && typ != TOKTPOUND
                 && typ != TOKTSYMBOL))
                can_fold = FALSE;              /* not constant - can't fold */
            
            if (typ == TOKTSYMBOL
                && (ncur->prsnv.prsnvn[0]->prsnv.prsnvt.toksym.tokstyp
                    == TOKSTLOCAL
                    || ncur->prsnv.prsnvn[0]->prsnv.prsnvt.toksym.tokstyp
                    == TOKSTSELF))
                can_fold = FALSE;
            
            if (ncur->prsnv.prsnvn[0]->prsnnlf == 0 && typ == TOKTSYMBOL)
                prsdef(ctx, &ncur->prsnv.prsnvn[0]->prsnv.prsnvt,
                       TOKSTFWDOBJ);
        }
        if (can_fold)
        {
            tokdef    t;
            emtlidef *lst;
            prsndef  *retval;
            emtledef *ele;
            
            lst = (emtlidef *)prsbalo(ctx, (uint)(sizeof(emtlidef) +
                                                 (i - 1) * sizeof(emtledef)));
            t.toktyp = TOKTLIST;
            t.tokofs = ((uchar *)lst) - &ctx->prscxpool[0];
            retval = prsnew0(ctx, &t);
            
            lst->emtlicnt = i;
            
            for (ele = &lst->emtliele[0] ; node ;
                   node = node->prsnv.prsnvn[1], ++ele)
            {
                ncur = node->prsnv.prsnvn[0];
                switch(ele->emtletyp = ncur->prsnv.prsnvt.toktyp)
                {
                case TOKTLIST:
                case TOKTSSTRING:
                case TOKTPOUND:
                    ele->emtleval = ncur->prsnv.prsnvt.tokofs;
                    break;
                    
                case TOKTSYMBOL:
                    switch(ncur->prsnv.prsnvt.toksym.tokstyp)
                    {
                    case TOKSTFUNC:
                    case TOKSTFWDFN:
                        ele->emtletyp = TOKTFUNCTION;
                        break;
                    case TOKSTOBJ:
                    case TOKSTFWDOBJ:
                        ele->emtletyp = TOKTOBJECT;
                        break;
                    case TOKSTPROP:
                        ele->emtletyp = TOKTDOT;
                        break;
                    case TOKSTPROPSPEC:
                        ele->emtletyp = TOKTDOT;
                        break;
                    default:
                        errsig(ctx->prscxerr, ERR_INVLSTE);
                    }
                    ele->emtleval = ncur->prsnv.prsnvt.toksym.toksval;
                    break;
                    
                default:
                    ele->emtleval = ncur->prsnv.prsnvt.tokval;
                    break;
                }
            }

            node = retval;
        }
        return(node);
    }
    
    /*
     *   If we have sub-nodes, try to fold them.  If they fold down to
     *   leaf nodes, we can try to apply the expression to them. 
     */
    for (i = node->prsnnlf, n = &node->prsnv.prsnvn[0] ; i ; ++n, --i)
    {
        *n = prsfold(ctx, *n);
        if ((*n)->prsnnlf != 0 ||
            ((typ = (*n)->prsnv.prsnvt.toktyp) != TOKTNUMBER &&
             typ != TOKTSSTRING && typ != TOKTLIST &&
             typ != TOKTNIL && typ != TOKTTRUE && typ != TOKTPOUND))
            can_fold = FALSE;                  /* not constant - can't fold */
    }

    /* if at a leaf, or subnodes are non-constant, can't fold anything */
    if (node->prsnnlf == 0 || !can_fold) return(node);

    switch(node->prsnnlf)
    {
    case 1:
        tok1 = &node->prsnv.prsnvn[0]->prsnv.prsnvt;
        typ1 = tok1->toktyp;
        val1 = tok1->tokval;
        
        switch(node->prsntyp)
        {
        case TOKTPLUS:
            break;
            
        case TOKTMINUS:
            if (typ1 != TOKTNUMBER)
                errsig(ctx->prscxerr, ERR_INVOP);
            tok1->tokval = -val1;
            break;
            
        case TOKTNOT:
            if (!prsvlog(typ1))
                errsig(ctx->prscxerr, ERR_INVOP);
            tok1->toktyp = (prs2log(typ1, val1) == TOKTNIL ?
                            TOKTTRUE : TOKTNIL);
            break;

        case TOKTTILDE:
            if (typ1 != TOKTNUMBER)
                errsig(ctx->prscxerr, ERR_INVOP);
            tok1->tokval = ~val1;
            break;
            
        default:
            return(node);
        }
        break;
        
    case 2:
        tok1 = &node->prsnv.prsnvn[0]->prsnv.prsnvt;
        tok2 = &node->prsnv.prsnvn[1]->prsnv.prsnvt;
        val1 = tok1->tokval;
        val2 = tok2->tokval;
        typ1 = tok1->toktyp;
        typ2 = tok2->toktyp;
        
        switch(node->prsntyp)
        {
        case TOKTOR:
        case TOKTAND:
            if (!prsvlog(typ1) || !prsvlog(typ2))
                errsig(ctx->prscxerr, ERR_INVOP);
            typ1 = (prs2log(typ1, val1) == TOKTTRUE);
            typ2 = (prs2log(typ2, val2) == TOKTTRUE);

            if (node->prsntyp == TOKTAND) typ1 = typ1 && typ2;
            else                          typ1 = typ1 || typ2;

            tok1->toktyp = (typ1 ? TOKTTRUE : TOKTNIL);
            break;

        case TOKTPLUS:
        case TOKTMINUS:
            if (typ1 == TOKTSSTRING || typ1 == TOKTLIST || typ2 == TOKTLIST)
                return(node);
            /* FALLTHROUGH */
            
        case TOKTEQ:
        case TOKTNE:
        case TOKTGT:
        case TOKTGE:
        case TOKTLT:
        case TOKTLE:
            if (typ1 != TOKTNUMBER || typ2 != TOKTNUMBER)
                return(node);
            /* FALLTHROUGH */

        case TOKTXOR:
            if ((typ1 == TOKTTRUE || typ1 == TOKTNIL)
                && (typ2 == TOKTTRUE || typ2 == TOKTNIL))
            {
                int a, b;

                a = (typ1 == TOKTTRUE ? 1 : 0);
                b = (typ2 == TOKTTRUE ? 1 : 0);
                tok1->toktyp = ((a ^ b) ? TOKTTRUE : TOKTNIL);
                break;
            }
            /* FALLTHROUGH */

        case TOKTDIV:
        case TOKTTIMES:
        case TOKTMOD:
        case TOKTSHL:
        case TOKTSHR:
            if (typ1 != TOKTNUMBER || typ2 != TOKTNUMBER)
                errsig(ctx->prscxerr, ERR_INVOP);
            switch(node->prsntyp)
            {
            case TOKTPLUS:
                val1 += val2;
                break;
            case TOKTMINUS:
                val1 -= val2;
                break;
            case TOKTTIMES:
                val1 *= val2;
                break;
            case TOKTDIV:
                if (val2 == 0)
                    errsig(ctx->prscxerr, ERR_DIVZERO);
                val1 /= val2;
                break;
            case TOKTMOD:
                if (val2 == 0)
                    errsig(ctx->prscxerr, ERR_DIVZERO);
                val1 %= val2;
                break;
            case TOKTXOR:
                val1 ^= val2;
                break;
            case TOKTSHL:
                val1 <<= val2;
                break;
            case TOKTSHR:
                val1 >>= val2;
                break;
            case TOKTEQ:
                typ1 = (val1 == val2 ? TOKTTRUE : TOKTNIL);
                break;
            case TOKTNE:
                typ1 = (val1 != val2 ? TOKTTRUE : TOKTNIL);
                break;
            case TOKTGT:
                typ1 = (val1 > val2 ? TOKTTRUE : TOKTNIL);
                break;
            case TOKTLT:
                typ1 = (val1 < val2 ? TOKTTRUE : TOKTNIL);
                break;
            case TOKTLE:
                typ1 = (val1 <= val2 ? TOKTTRUE : TOKTNIL);
                break;
            case TOKTGE:
                typ1 = (val1 >= val2 ? TOKTTRUE : TOKTNIL);
                break;
                
            default:
                return(node);
            }
            tok1->toktyp = typ1;
            tok1->tokval = val1;
            break;
            
        default:
            return(node);
        }
        break;
        
    case 3:
        tok1 = &node->prsnv.prsnvn[0]->prsnv.prsnvt;
        if (!prsvlog(tok1->toktyp)) errsig(ctx->prscxerr, ERR_INVOP);
        if (prs2log(tok1->toktyp, tok1->tokval) == TOKTTRUE)
            return(node->prsnv.prsnvn[1]);
        else
            return(node->prsnv.prsnvn[2]);
        
    default:
        return(node);
    }

    /* return the first sub-node, which has the folded value */
    return(node->prsnv.prsnvn[0]);
}